

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  undefined8 *puVar1;
  long lVar2;
  ctrl_t *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  uintptr_t v;
  ulong uVar6;
  uintptr_t v_3;
  size_t sVar7;
  size_t sVar8;
  undefined8 *puVar9;
  ctrl_t cVar10;
  ulong uVar11;
  ulong uVar12;
  FindInfo FVar13;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_48 = common->capacity_;
    local_40 = (byte)common->size_ & 1;
    local_3f = 0;
    local_58.heap.control = (common->heap_or_soo_).heap.control;
    local_58.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
    CommonFields::set_capacity(common,new_capacity);
    bVar5 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,24ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,0x10,0x18);
    if (local_48 != 0) {
      if (bVar5) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,void>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
                  ((HashSetResizeHelper *)&local_58.heap,common,
                   (allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>
                    *)common);
      }
      else {
        if ((char)local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
        puVar9 = (undefined8 *)((long)local_58.heap.slot_array + 0x10);
        sVar8 = 0;
        sVar7 = local_48;
        do {
          if ((char)local_3f == '\x01') {
            __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7e6,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (kSentinel < local_58.heap.control[sVar8]) {
            uVar11 = (puVar9[-2] ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                     -0x234dd359734ecb13;
            uVar11 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                       (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                       (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                       (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ puVar9[-2]) *
                     -0x234dd359734ecb13;
            uVar11 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                       (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                       (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                       (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ puVar9[-1]) *
                     -0x234dd359734ecb13;
            uVar12 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                       (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                       (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                       (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ puVar9[-1]) *
                     -0x234dd359734ecb13;
            FVar13 = find_first_non_full<void>
                               (common,uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                       (uVar12 & 0xff0000000000) >> 0x18 |
                                       (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 |
                                       (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
                                       uVar12 << 0x38);
            uVar6 = FVar13.offset;
            uVar11 = common->capacity_;
            if (uVar11 <= uVar6) {
              __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x744,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar10 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
            pcVar3 = (common->heap_or_soo_).heap.control;
            pcVar3[uVar6] = cVar10;
            pcVar3[(ulong)((uint)uVar11 & 0xf) + (uVar6 - 0xf & uVar11)] = cVar10;
            common->capacity_ = 0xffffffffffffff9c;
            uVar4 = puVar9[-1];
            puVar1 = (undefined8 *)(lVar2 + uVar6 * 0x18);
            *puVar1 = puVar9[-2];
            puVar1[1] = uVar4;
            *(undefined8 *)(lVar2 + 0x10 + uVar6 * 0x18) = *puVar9;
            *puVar9 = 0;
            CommonFields::set_capacity(common,uVar11);
            sVar7 = local_48;
          }
          sVar8 = sVar8 + 1;
          puVar9 = puVar9 + 3;
        } while (sVar8 != sVar7);
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x18);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }